

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.cpp
# Opt level: O0

TestLog * vk::operator<<(TestLog *log,SpirVAsmSource *source)

{
  TestLog *pTVar1;
  LogSpirVAssemblySource local_98;
  allocator<char> local_61;
  string local_60;
  LogShaderProgram local_40;
  string *local_18;
  SpirVAsmSource *source_local;
  TestLog *log_local;
  
  local_18 = &source->source;
  source_local = (SpirVAsmSource *)log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  tcu::LogShaderProgram::LogShaderProgram(&local_40,true,&local_60);
  pTVar1 = tcu::TestLog::operator<<(log,&local_40);
  tcu::LogSpirVAssemblySource::LogSpirVAssemblySource(&local_98,local_18);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_98);
  tcu::TestLog::operator<<(pTVar1,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  tcu::LogSpirVAssemblySource::~LogSpirVAssemblySource(&local_98);
  tcu::LogShaderProgram::~LogShaderProgram(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return (TestLog *)source_local;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const SpirVAsmSource& source)
{
	log << tcu::TestLog::ShaderProgram(true , "")
		<< tcu::TestLog::SpirVAssemblySource(source.source)
		<< tcu::TestLog::EndShaderProgram;

	return log;
}